

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceStatement
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  ServiceOptions *options;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>_>
  *method;
  string_view text;
  string_view text_00;
  LocationRecorder location;
  
  text._M_str = ";";
  text._M_len = 1;
  bVar1 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  bVar2 = true;
  if (!bVar1) {
    text_00._M_str = "option";
    text_00._M_len = 6;
    bVar1 = LookingAt(this,text_00);
    if (bVar1) {
      LocationRecorder::LocationRecorder(&location,service_location,3);
      options = ServiceDescriptorProto::mutable_options(service);
      bVar2 = ParseOption(this,&options->super_Message,&location,containing_file,OPTION_STATEMENT);
    }
    else {
      LocationRecorder::LocationRecorder
                (&location,service_location,2,*(int *)((long)&service->field_0 + 0x10));
      method = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                         (&(service->field_0)._impl_.method_.super_RepeatedPtrFieldBase);
      bVar2 = ParseServiceMethod(this,method,&location,containing_file);
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseServiceStatement(ServiceDescriptorProto* service,
                                   const LocationRecorder& service_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kOptionsFieldNumber);
    return ParseOption(service->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kMethodFieldNumber,
                              service->method_size());
    return ParseServiceMethod(service->add_method(), location, containing_file);
  }
}